

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psmodule.c
# Opt level: O1

FT_UInt ps_unicodes_char_index(PS_Unicodes table,FT_UInt32 unicode)

{
  PS_UniMap *pPVar1;
  bool bVar2;
  PS_UniMap *pPVar3;
  PS_UniMap *pPVar4;
  PS_UniMap *pPVar5;
  PS_UniMap *pPVar6;
  uint uVar7;
  
  pPVar3 = table->maps;
  pPVar4 = pPVar3 + ((ulong)table->num_maps - 1);
  pPVar6 = (PS_UniMap *)0x0;
  do {
    pPVar5 = pPVar6;
    if (pPVar4 < pPVar3) break;
    pPVar1 = pPVar3 + ((long)pPVar4 - (long)pPVar3 >> 4);
    pPVar5 = pPVar1;
    if (pPVar1->unicode == unicode) {
      bVar2 = false;
    }
    else {
      uVar7 = pPVar1->unicode & 0x7fffffff;
      if (uVar7 != unicode) {
        pPVar5 = pPVar6;
      }
      if (pPVar3 == pPVar4) {
        bVar2 = false;
      }
      else {
        if (uVar7 < unicode) {
          pPVar3 = pPVar1 + 1;
        }
        else {
          pPVar4 = pPVar1 + -1;
        }
        bVar2 = true;
      }
    }
    pPVar6 = pPVar5;
  } while (bVar2);
  if (pPVar5 == (PS_UniMap *)0x0) {
    return 0;
  }
  return pPVar5->glyph_index;
}

Assistant:

static FT_UInt
  ps_unicodes_char_index( PS_Unicodes  table,
                          FT_UInt32    unicode )
  {
    PS_UniMap  *min, *max, *mid, *result = NULL;


    /* Perform a binary search on the table. */

    min = table->maps;
    max = min + table->num_maps - 1;

    while ( min <= max )
    {
      FT_UInt32  base_glyph;


      mid = min + ( ( max - min ) >> 1 );

      if ( mid->unicode == unicode )
      {
        result = mid;
        break;
      }

      base_glyph = BASE_GLYPH( mid->unicode );

      if ( base_glyph == unicode )
        result = mid; /* remember match but continue search for base glyph */

      if ( min == max )
        break;

      if ( base_glyph < unicode )
        min = mid + 1;
      else
        max = mid - 1;
    }

    if ( result )
      return result->glyph_index;
    else
      return 0;
  }